

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_00295030;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->java_package_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->java_outer_classname_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->optimize_for_ = 1;
  this->java_multiple_files_ = false;
  this->java_generate_equals_and_hash_ = false;
  this->cc_generic_services_ = false;
  this->java_generic_services_ = false;
  this->go_package_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->py_generic_services_ = false;
  return;
}

Assistant:

FileOptions::FileOptions()
  : ::google::protobuf::Message() {
  SharedCtor();
}